

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_1e0;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string shader_source;
  size_t string_index;
  allocator<char> local_81;
  string *local_80;
  string local_78 [8];
  string input [3];
  TestShaderType tested_shader_type_local;
  ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  string_index._1_1_ = 1;
  local_80 = local_78;
  input[2].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"    x[ivec2(0)] = 1.0;\n\n",&local_81);
  local_80 = (string *)(input[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[0].field_2._M_local_buf + 8),"    x[ivec3(0)] = 1.0;\n\n",
             (allocator<char> *)((long)&string_index + 3));
  local_80 = (string *)(input[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input[1].field_2._M_local_buf + 8),"    x[ivec4(0)] = 1.0;\n\n",
             (allocator<char> *)((long)&string_index + 2));
  string_index._1_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&string_index + 3));
  std::allocator<char>::~allocator(&local_81);
  for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 3;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,"    float x",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_168,"[2]",&local_169);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])
              (&local_120,this,local_140,local_168,(long)(shader_source.field_2._8_4_ + 2));
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_,&local_120);
    std::operator+(&local_e0,&local_100,";\n\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input[shader_source.field_2._8_8_ + -1].field_2 + 8));
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    switch(input[2].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_c0,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_c0,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_c0,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xcf2);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_c0,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)input[2].field_2._12_4_,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
  local_1e0 = (string *)(input[2].field_2._M_local_buf + 8);
  do {
    local_1e0 = local_1e0 + -0x20;
    std::__cxx11::string::~string(local_1e0);
  } while (local_1e0 != local_78);
  return;
}

Assistant:

void ExpressionsIndexingArray3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    x[ivec2(0)] = 1.0;\n\n", "    x[ivec3(0)] = 1.0;\n\n", "    x[ivec4(0)] = 1.0;\n\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + this->extend_string("    float x", "[2]", (int)string_index + 2) +
									";\n\n" + input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}